

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall sznet::Logger::~Logger(Logger *this)

{
  Buffer *pBVar1;
  
  Impl::finish(&this->m_impl);
  pBVar1 = &(this->m_impl).m_stream.m_buffer;
  (*(code *)g_output)(pBVar1,*(int *)&(this->m_impl).m_stream.m_buffer.m_cur - (int)pBVar1);
  if ((this->m_impl).m_level != FATAL) {
    return;
  }
  (*(code *)g_flush)();
  abort();
}

Assistant:

Logger::~Logger()
{
	m_impl.finish();
	const LogStream::Buffer& buf(stream().buffer());
	g_output(buf.data(), buf.length());
	if (m_impl.m_level == FATAL)
	{
		g_flush();
		abort();
	}
}